

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

void __thiscall xray_re::xr_mesh_builder::create_edges(xr_mesh_builder *this,bool calc_smoothness)

{
  undefined2 uVar1;
  uint uVar2;
  pointer pbVar3;
  pointer puVar4;
  bool bVar5;
  b_edge *pbVar6;
  long lVar7;
  ulong v0;
  pointer this_00;
  ulong v1;
  uint32_t local_58;
  b_edge local_48;
  pointer local_38;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->m_vertex_edges,
             ((long)(this->super_xr_mesh).m_points.
                    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_xr_mesh).m_points.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc,&BAD_IDX);
  pbVar3 = (this->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_edges).
      super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    (this->m_edges).
    super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  reserve(&this->m_edges,
          ((long)(this->super_xr_mesh).m_points.
                 super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_xr_mesh).m_points.
                super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  this_00 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->m_faces).
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = 0;
  for (; this_00 != local_38; this_00 = this_00 + 1) {
    v1 = (ulong)(this_00->field_0).field_0.v[0];
    for (lVar7 = 0xb; lVar7 != 8; lVar7 = lVar7 + -1) {
      v0 = (ulong)*(uint *)((long)this_00 + lVar7 * 4 + -0x24);
      pbVar6 = find_edge(this,v0,v1);
      if (pbVar6 == (b_edge *)0x0) {
        (this_00->field_0).__refs[lVar7] = 0xffffffff;
        puVar4 = (this->m_vertex_edges).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_48.link = puVar4[v0];
        puVar4[v0] = (uint)((ulong)((long)(this->m_edges).
                                          super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_edges).
                                         super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
        local_48.v1 = (uint32_t)v1;
        local_48.face0 = local_58;
        local_48.size = 1;
        local_48.smooth = false;
        local_48.border = false;
        std::
        vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
        ::emplace_back<xray_re::xr_mesh_builder::b_edge>(&this->m_edges,&local_48);
      }
      else {
        uVar2 = pbVar6->face0;
        (this_00->field_0).__refs[lVar7] = uVar2;
        uVar1 = pbVar6->size;
        pbVar6->size = uVar1 + 1;
        if (calc_smoothness) {
          if ((uint16_t)(uVar1 + 1) == 2) {
            bVar5 = b_face::is_edge_smooth
                              (this_00,(this->m_faces).
                                       super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar2,v0,v1);
          }
          else {
            bVar5 = false;
          }
          pbVar6->smooth = bVar5;
        }
        pbVar6->face0 = local_58;
      }
      v1 = v0;
    }
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void xr_mesh_builder::create_edges(bool calc_smoothness)
{
	m_vertex_edges.assign(m_points.size(), BAD_IDX);
	m_edges.clear();
	m_edges.reserve(m_points.size());
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		for (uint_fast32_t i = 3, v0, v1 = it->v0; i != 0; v1 = v0) {
			b_edge* edge = find_edge(v0 = it->v[--i], v1);
			if (edge == 0) {
				it->link[i] = BAD_IDX;
				uint32_t next = m_vertex_edges[v0];
				m_vertex_edges[v0] = uint32_t(m_edges.size() & UINT32_MAX);
				m_edges.push_back(b_edge(v1, face_idx, next));
			} else {
				it->link[i] = edge->face0;
				if (!calc_smoothness) {
					++edge->size;
				} else {
					edge->smooth = (++edge->size == 2) ?
							it->is_edge_smooth(m_faces[edge->face0], v0, v1) : false;
				}
				edge->face0 = face_idx;
			}
		}
	}
}